

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O0

u4 __thiscall ClassLoader::readU4(ClassLoader *this,FILE *fp)

{
  byte bVar1;
  int local_20;
  u4 local_1c;
  int i;
  u4 result;
  FILE *fp_local;
  ClassLoader *this_local;
  
  local_1c = 0;
  _i = fp;
  fp_local = (FILE *)this;
  if ((this->isLittleEndian & 1U) == 0) {
    fread(&local_1c,4,1,(FILE *)fp);
  }
  else {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      bVar1 = readU1(this,_i);
      local_1c = ((uint)bVar1 << (0x18U - (char)(local_20 << 3) & 0x1f)) + local_1c;
    }
  }
  return local_1c;
}

Assistant:

u4 ClassLoader::readU4(FILE *fp) {
    u4 result = 0;
    
    if (isLittleEndian) {
        for (int i = 0; i < 4; i++) {
            result += readU1(fp) << (24 - 8*i);
        }
    } else {
        fread(&result, sizeof(u4), 1, fp);
    }
    
    return result;
}